

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O1

tuple<int,_int> __thiscall Maze::adjacentCells(Maze *this,int row,int column)

{
  long lVar1;
  long lVar2;
  uint in_ECX;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  reference rVar10;
  
  lVar6 = CONCAT44(in_register_00000034,row);
  uVar5 = (ulong)in_ECX;
  iVar8 = column + 1;
  uVar7 = (ulong)iVar8;
  lVar1 = *(long *)(lVar6 + 0x58);
  uVar3 = (*(long *)(lVar6 + 0x60) - lVar1 >> 3) * -0x5555555555555555;
  uVar9 = (ulong)(int)in_ECX;
  if (uVar7 <= uVar3 && uVar3 - uVar7 != 0) {
    lVar2 = *(long *)(lVar1 + uVar7 * 0x18);
    uVar3 = uVar9;
    if ((ulong)(*(long *)(lVar1 + 8 + uVar7 * 0x18) - lVar2) <= uVar9) goto LAB_00103298;
    if (*(char *)(lVar2 + uVar9) == '0') {
      uVar4 = (*(long *)(lVar6 + 0x90) - *(long *)(lVar6 + 0x88) >> 3) * -0x3333333333333333;
      uVar3 = uVar7;
      if (uVar4 < uVar7 || uVar4 - uVar7 == 0) goto LAB_00103298;
      rVar10 = std::vector<bool,_std::allocator<bool>_>::at
                         ((vector<bool,_std::allocator<bool>_> *)
                          (*(long *)(lVar6 + 0x88) + uVar7 * 0x28),uVar9);
      if ((*rVar10._M_p & rVar10._M_mask) == 0) goto LAB_00103254;
    }
  }
  if (0 < column) {
    iVar8 = column + -1;
    uVar4 = (ulong)iVar8;
    lVar1 = *(long *)(lVar6 + 0x58);
    uVar7 = (*(long *)(lVar6 + 0x60) - lVar1 >> 3) * -0x5555555555555555;
    uVar3 = uVar4;
    if ((uVar7 < uVar4 || uVar7 - uVar4 == 0) ||
       (lVar2 = *(long *)(lVar1 + uVar4 * 0x18), uVar3 = uVar9,
       (ulong)(*(long *)(lVar1 + 8 + uVar4 * 0x18) - lVar2) <= uVar9)) goto LAB_00103298;
    if (*(char *)(lVar2 + uVar9) == '0') {
      uVar7 = (*(long *)(lVar6 + 0x90) - *(long *)(lVar6 + 0x88) >> 3) * -0x3333333333333333;
      uVar3 = uVar4;
      if (uVar7 < uVar4 || uVar7 - uVar4 == 0) goto LAB_00103298;
      rVar10 = std::vector<bool,_std::allocator<bool>_>::at
                         ((vector<bool,_std::allocator<bool>_> *)
                          (*(long *)(lVar6 + 0x88) + uVar4 * 0x28),uVar9);
      if ((*rVar10._M_p & rVar10._M_mask) == 0) goto LAB_00103254;
    }
  }
  uVar7 = (ulong)column;
  iVar8 = column;
  if (0 < (int)in_ECX) {
    lVar1 = *(long *)(lVar6 + 0x58);
    uVar5 = (*(long *)(lVar6 + 0x60) - lVar1 >> 3) * -0x5555555555555555;
    uVar3 = uVar7;
    if (uVar5 < uVar7 || uVar5 - uVar7 == 0) goto LAB_00103298;
    uVar5 = uVar9 - 1;
    lVar2 = *(long *)(lVar1 + uVar7 * 0x18);
    uVar3 = uVar5;
    if ((ulong)(*(long *)(lVar1 + 8 + uVar7 * 0x18) - lVar2) <= uVar5) goto LAB_00103298;
    if (*(char *)(lVar2 + uVar5) == '0') {
      uVar4 = (*(long *)(lVar6 + 0x90) - *(long *)(lVar6 + 0x88) >> 3) * -0x3333333333333333;
      uVar3 = uVar7;
      if (uVar4 < uVar7 || uVar4 - uVar7 == 0) goto LAB_00103298;
      rVar10 = std::vector<bool,_std::allocator<bool>_>::at
                         ((vector<bool,_std::allocator<bool>_> *)
                          (*(long *)(lVar6 + 0x88) + uVar7 * 0x28),uVar5);
      if ((*rVar10._M_p & rVar10._M_mask) == 0) goto LAB_00103254;
    }
  }
  lVar1 = *(long *)(lVar6 + 0x58);
  uVar5 = (*(long *)(lVar6 + 0x60) - lVar1 >> 3) * -0x5555555555555555;
  uVar3 = uVar7;
  if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
LAB_00103298:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
  }
  uVar9 = uVar9 + 1;
  lVar2 = *(long *)(lVar1 + uVar7 * 0x18);
  if ((uVar9 < (ulong)(*(long *)(lVar1 + 8 + uVar7 * 0x18) - lVar2)) &&
     (*(char *)(lVar2 + uVar9) == '0')) {
    uVar5 = (*(long *)(lVar6 + 0x90) - *(long *)(lVar6 + 0x88) >> 3) * -0x3333333333333333;
    if (uVar5 < uVar7 || uVar5 - uVar7 == 0) goto LAB_00103298;
    rVar10 = std::vector<bool,_std::allocator<bool>_>::at
                       ((vector<bool,_std::allocator<bool>_> *)
                        (*(long *)(lVar6 + 0x88) + uVar7 * 0x28),uVar9);
    if ((*rVar10._M_p & rVar10._M_mask) == 0) {
      uVar5 = uVar9 & 0xffffffff;
      goto LAB_00103254;
    }
  }
  uVar5 = 0xffffffff;
  iVar8 = -1;
LAB_00103254:
  *(int *)&(this->pathStack).c.
           super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
           super__Deque_impl_data._M_map = (int)uVar5;
  *(int *)((long)&(this->pathStack).c.
                  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                  _M_impl.super__Deque_impl_data._M_map + 4) = iVar8;
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int, int> Maze::adjacentCells (int row, int column){
    //if theirs a successor return it's index, otherwise return somthing invalid.

    std::tuple<int, int> NoSuccessor = std::make_tuple(-1,-1);
    if(row+1<MazeMatrix.size() && MazeMatrix.at(row+1).at(column) == '0'&& !used.at(row+1).at(column)) {
        return std::make_tuple(row+1, column);
        //checking vertical down
    }
    else if(row >= 1 && MazeMatrix.at(row-1).at(column) == '0' && !used.at(row-1).at(column)){
        return std::make_tuple(row-1, column);
        //checking vertical up
    }
    //
    else if(column >= 1 && MazeMatrix.at(row).at(column -1) == '0' && !used.at(row).at(column-1)){
        return std::make_tuple(row,column -1);
        //checking left
    }
    else if(column+1 < MazeMatrix.at(row).size() && MazeMatrix.at(row).at(column + 1) == '0' && !used.at(row).at(column + 1)){
        return std::make_tuple(row,column + 1);
        //checking right.
    }
    else{
        return NoSuccessor;
    }
}